

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int32 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this,int64 position)

{
  int64 position_local;
  MkvWriter *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = fseeko((FILE *)this->file_,position,0);
  }
  return this_local._4_4_;
}

Assistant:

int32 MkvWriter::Position(int64 position) {
  if (!file_)
    return -1;

#ifdef _MSC_VER
  return _fseeki64(file_, position, SEEK_SET);
#elif defined(_WIN32)
  return fseeko64(file_, static_cast<off_t>(position), SEEK_SET);
#else
  return fseeko(file_, static_cast<off_t>(position), SEEK_SET);
#endif
}